

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

PVIPNode * PVIP_parse_string(pvip_t *pvip,char *string,int len,int debug,PVIPString **error)

{
  byte c;
  size_t sVar1;
  int iVar2;
  size_t len_00;
  PVIPString *pPVar3;
  long lVar4;
  PVIPNode *pPVar5;
  GREG local_d0;
  
  memset(&local_d0,0,0xa0);
  local_d0.data.line_number = 1;
  local_d0.data.line_number_stack = (int *)0x0;
  local_d0.data.line_number_stack_size = 0;
  local_d0.data.is_string = local_d0.data.line_number;
  local_d0.data.str = (PVIPParserStringState *)malloc(0x18);
  (local_d0.data.str)->buf = string;
  (local_d0.data.str)->len = (long)len;
  (local_d0.data.str)->pos = 0;
  local_d0.data.pvip = pvip;
  iVar2 = PVIP_parse(&local_d0);
  if (iVar2 == 0) {
    if (error != (PVIPString **)0x0) {
      pPVar3 = PVIP_string_new();
      *error = pPVar3;
      PVIP_string_concat(pPVar3,"** Syntax error at line ",0x18);
      PVIP_string_concat_int(*error,(long)local_d0.data.line_number);
      PVIP_string_concat(*error,"\n",1);
      if (*local_d0.text != '\0') {
        PVIP_string_concat(*error,"** near ",8);
        pPVar3 = *error;
        len_00 = strlen(local_d0.text);
        PVIP_string_concat(pPVar3,local_d0.text,len_00);
      }
      if ((local_d0.pos < local_d0.limit) || ((local_d0.data.str)->len == (local_d0.data.str)->pos))
      {
        local_d0.buf[local_d0.limit] = '\0';
        PVIP_string_concat(*error," before text \"",0xe);
        while (((lVar4 = (long)local_d0.pos, local_d0.pos < local_d0.limit &&
                (local_d0.buf[lVar4] != '\n')) && (local_d0.buf[lVar4] != '\r'))) {
          local_d0.pos = local_d0.pos + 1;
          PVIP_string_concat_char(*error,local_d0.buf[lVar4]);
        }
        if (local_d0.pos == local_d0.limit) {
          while (sVar1 = (local_d0.data.str)->pos, (local_d0.data.str)->len != sVar1) {
            (local_d0.data.str)->pos = sVar1 + 1;
            c = (local_d0.data.str)->buf[sVar1];
            if ((c < 0xe) && ((0x2401U >> (c & 0x1f) & 1) != 0)) break;
            PVIP_string_concat_char(*error,c);
          }
        }
        PVIP_string_concat_char(*error,'\"');
      }
      PVIP_string_concat(*error,"\n\n",2);
      free(local_d0.data.str);
    }
  }
  else {
    pPVar5 = local_d0.data.root;
    if ((local_d0.limit == local_d0.pos) || (pPVar5 = (PVIPNode *)0x0, error == (PVIPString **)0x0))
    goto LAB_001039c4;
    pPVar3 = PVIP_string_new();
    *error = pPVar3;
    PVIP_string_concat(pPVar3,"Syntax error! Around:\n",0x16);
    for (; (lVar4 = (long)local_d0.pos, local_d0.limit != local_d0.pos && ((uint)pPVar5 < 0x18));
        pPVar5 = (PVIPNode *)(ulong)((uint)pPVar5 + 1)) {
      local_d0.pos = local_d0.pos + 1;
      if ((local_d0.data.str)->buf[lVar4] != '\0') {
        PVIP_string_concat_char(*error,(local_d0.data.str)->buf[lVar4]);
      }
    }
    PVIP_string_concat_char(*error,'\n');
  }
  pPVar5 = (PVIPNode *)0x0;
LAB_001039c4:
  free(local_d0.data.line_number_stack);
  free(local_d0.data.str);
  if (local_d0.data.root == (PVIPNode *)0x0) {
    __assert_fail("g.data.root",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/build_O2/gen.pvip.y.c"
                  ,0x2c28,
                  "PVIPNode *PVIP_parse_string(pvip_t *, const char *, int, int, PVIPString **)");
  }
  PVIP_deinit(&local_d0);
  return pPVar5;
}

Assistant:

PVIPNode * PVIP_parse_string(pvip_t* pvip, const char *string, int len, int debug, PVIPString **error) {
    PVIPNode *root = NULL;

    GREG g;
    YY_NAME(init)(&g);

#ifdef YY_DEBUG
    g.debug=debug;
#endif

    g.data.line_number = 1;
    g.data.line_number_stack_size = 0;
    g.data.line_number_stack = NULL;
    g.data.is_string   = 1;
    g.data.str = malloc(sizeof(PVIPParserStringState));
    g.data.str->buf     = string;
    g.data.str->len     = len;
    g.data.str->pos     = 0;
    g.data.pvip = pvip;

    if (!YY_NAME(parse)(&g)) {
      if (error) {
        *error = PVIP_string_new();
        PVIP_string_concat(*error, "** Syntax error at line ", strlen("** Syntax error at line "));
        PVIP_string_concat_int(*error, g.data.line_number);
        PVIP_string_concat(*error, "\n", 1);
        if (g.text[0]) {
            PVIP_string_concat(*error, "** near ", strlen("** near "));
            PVIP_string_concat(*error, g.text, strlen(g.text));
        }
        if (g.pos < g.limit || g.data.str->len==g.data.str->pos) {
            g.buf[g.limit]= '\0';
            PVIP_string_concat(*error, " before text \"", strlen(" before text \""));
            while (g.pos < g.limit) {
                if ('\n' == g.buf[g.pos] || '\r' == g.buf[g.pos]) break;
                PVIP_string_concat_char(*error, g.buf[g.pos++]);
            }
            if (g.pos == g.limit) {
                while (g.data.str->len!=g.data.str->pos) {
                    char ch = g.data.str->buf[g.data.str->pos++];
                    if (!ch || '\n' == ch || '\r' == ch) {
                        break;
                    }
                    PVIP_string_concat_char(*error, ch);
                }
            }
            PVIP_string_concat_char(*error, '\"');
        }
        PVIP_string_concat(*error, "\n\n", 2);
        free(g.data.str);
      }
      goto finished;
    }
    if (g.limit!=g.pos) {
        if (error) {
            *error = PVIP_string_new();
            PVIP_string_concat(*error, "Syntax error! Around:\n", strlen("Syntax error! Around:\n"));
            int i;
            for (i=0; g.limit!=g.pos && i<24; i++) {
                char ch = g.data.str->buf[g.pos++];
                if (ch) {
                    PVIP_string_concat_char(*error, ch);
                }
            }
            PVIP_string_concat_char(*error, '\n');
        }
        goto finished;
    }
    root = g.data.root;

finished:

    free(g.data.line_number_stack);
    free(g.data.str);
    assert(g.data.root);
    YY_NAME(deinit)(&g);
    return root;
}